

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_DsdManAddDsd_rec(char *pStr,char **p,int *pMatches,If_DsdMan_t *pMan,word *pTruth,
                       uchar *pPerm,int *pnSupp)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong *pLits_00;
  byte bVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  byte *pbVar13;
  int pLits_1 [12];
  int pLits [12];
  ulong local_268 [6];
  ulong local_238 [65];
  
  iVar3 = *pnSupp;
  cVar1 = **p;
  if (cVar1 == '!') {
    *p = *p + 1;
  }
  pbVar13 = (byte *)*p;
  bVar8 = *pbVar13;
  if ((byte)(bVar8 + 0x9f) < 0x1a) {
    if ('`' < (char)bVar8) {
      *pnSupp = iVar3 + 1;
      pPerm[iVar3] = (bVar8 * '\x02' | cVar1 == '!') + 0x3e;
      return 2;
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  if (((bVar8 - 0x3c < 0x40) && ((0x8000000080000001U >> ((ulong)(bVar8 - 0x3c) & 0x3f) & 1) != 0))
     || (bVar8 == 0x28)) {
    if (bVar8 < 0x5b) {
      iVar7 = 3;
      if (bVar8 != 0x28) {
        if (bVar8 != 0x3c) {
LAB_00424eba:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x69b,
                        "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                       );
        }
        iVar7 = 5;
      }
    }
    else if (bVar8 == 0x7b) {
      iVar7 = 6;
    }
    else {
      if (bVar8 != 0x5b) goto LAB_00424eba;
      iVar7 = 4;
    }
    pbVar10 = (byte *)(pStr + pMatches[(long)pbVar13 - (long)pStr]);
    if ((int)(char)bVar8 + (uint)(bVar8 != 0x28) + 1 != (int)(char)*pbVar10) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x69c,
                    "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                   );
    }
    pbVar13 = pbVar13 + 1;
    *p = (char *)pbVar13;
    lVar12 = 0;
    if (pbVar13 < pbVar10) {
      lVar12 = 0;
      do {
        iVar5 = If_DsdManAddDsd_rec(pStr,p,pMatches,pMan,pTruth,pPerm,pnSupp);
        *(int *)((long)local_238 + lVar12 * 4) = iVar5;
        lVar12 = lVar12 + 1;
        pbVar13 = (byte *)(*p + 1);
        *p = (char *)pbVar13;
      } while (pbVar13 < pbVar10);
    }
    iVar5 = (int)lVar12;
    if (pbVar13 != pbVar10) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x69f,
                    "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                   );
    }
    pLits_00 = local_238;
    goto LAB_00424b43;
  }
  if (5 < (byte)(bVar8 + 0xbf) && 9 < (byte)(bVar8 - 0x30)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x6b3,
                  "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                 );
  }
  pbVar10 = pbVar13;
  if (*pbVar13 == 0x30) {
    pbVar10 = pbVar13 + (ulong)(pbVar13[1] == 0x78) * 2;
  }
  bVar8 = *pbVar10;
  if ((0xf5 < (byte)(bVar8 - 0x3a)) || (uVar11 = 0, 0xf9 < (byte)((bVar8 & 0xdf) + 0xb9))) {
    uVar11 = 0;
    do {
      do {
        lVar12 = uVar11 + 1;
        uVar11 = uVar11 + 1;
      } while (0xf5 < (byte)(pbVar10[lVar12] - 0x3a));
    } while (0xf9 < (byte)((pbVar10[lVar12] & 0xdf) + 0xb9));
  }
  iVar5 = (int)uVar11;
  iVar7 = iVar5;
  if (iVar5 == 0) {
LAB_00424bc2:
    iVar7 = iVar7 + 2;
LAB_00424bc8:
    uVar6 = 1 << ((char)iVar7 - 6U & 0x1f);
    if (iVar7 < 7) {
      uVar6 = 1;
    }
    if (0 < (int)uVar6) {
      memset(local_238,0,(ulong)uVar6 << 3);
    }
    if (iVar5 != 0) {
      pbVar10 = pbVar10 + iVar5;
      bVar8 = 0;
      uVar9 = 0;
      do {
        pbVar10 = pbVar10 + -1;
        bVar2 = *pbVar10;
        iVar5 = -0x30;
        if (((9 < (byte)(bVar2 - 0x30)) && (iVar5 = -0x37, 5 < (byte)(bVar2 + 0xbf))) &&
           (iVar5 = -0x57, 5 < (byte)(bVar2 + 0x9f))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x4bf,"int Abc_TtReadHexDigit(char)");
        }
        local_238[uVar9 >> 4 & 0xfffffff] =
             local_238[uVar9 >> 4 & 0xfffffff] |
             (ulong)(uint)(iVar5 + (char)bVar2) << (bVar8 & 0x3c);
        uVar9 = uVar9 + 1;
        bVar8 = bVar8 + 4;
      } while ((uVar11 & 0xffffffff) != uVar9);
    }
    if (iVar7 < 6) {
      if (iVar7 < 0) {
        __assert_fail("nVars >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x489,"word Abc_Tt6Stretch(word, int)");
      }
      uVar6 = (uint)local_238[0] & 0xf;
      uVar11 = (ulong)(uVar6 << 4 | uVar6);
      if (iVar7 != 2) {
        uVar11 = local_238[0];
      }
      iVar5 = 3;
      if (iVar7 != 2) {
        iVar5 = iVar7;
      }
      uVar9 = (ulong)(uint)((int)(uVar11 & 0xff) << 8) | uVar11 & 0xff;
      if (iVar5 != 3) {
        uVar9 = uVar11;
      }
      uVar11 = (ulong)((uint)uVar9 << 0x10 | (uint)uVar9 & 0xffff);
      if (1 < iVar5 - 3U) {
        uVar11 = uVar9;
      }
      local_238[0] = (uVar11 & 0xffffffff) * 0x100000001;
    }
  }
  else {
    if (iVar5 != 1) {
      uVar6 = iVar5 - 1;
      if (uVar6 == 0) {
        iVar7 = 0;
      }
      else {
        uVar4 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        iVar7 = (uVar4 ^ 0xffffffe0) + 0x21;
      }
      goto LAB_00424bc2;
    }
    iVar7 = 2;
    if (bVar8 < 0x41) {
      if (bVar8 == 0x30) {
LAB_00424b7d:
        local_238[0] = -(ulong)(bVar8 != 0x30);
        iVar7 = 0;
        goto LAB_00424d2f;
      }
      if (bVar8 == 0x35) goto LAB_00424b95;
      goto LAB_00424bc8;
    }
    if (bVar8 != 0x41) {
      if (bVar8 != 0x46) goto LAB_00424bc8;
      goto LAB_00424b7d;
    }
LAB_00424b95:
    local_238[0] = 0xaaaaaaaaaaaaaaaa;
    if (bVar8 == 0x35) {
      local_238[0] = 0x5555555555555555;
    }
    iVar7 = 1;
  }
LAB_00424d2f:
  iVar5 = 1 << ((char)iVar7 - 2U & 0x1f);
  if (iVar7 < 3) {
    iVar5 = 1;
  }
  pbVar10 = pbVar13 + iVar5;
  *p = (char *)pbVar10;
  if ((pbVar13[iVar5] != 0x7b) ||
     (pbVar13 = (byte *)(pStr + pMatches[(long)pbVar10 - (long)pStr]), *pbVar13 != 0x7d)) {
    __assert_fail("**p == \'{\' && *q == \'}\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x6ab,
                  "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                 );
  }
  pbVar10 = pbVar10 + 1;
  *p = (char *)pbVar10;
  lVar12 = 0;
  if (pbVar10 < pbVar13) {
    lVar12 = 0;
    do {
      iVar5 = If_DsdManAddDsd_rec(pStr,p,pMatches,pMan,pTruth,pPerm,pnSupp);
      *(int *)((long)local_268 + lVar12 * 4) = iVar5;
      lVar12 = lVar12 + 1;
      pbVar10 = (byte *)(*p + 1);
      *p = (char *)pbVar10;
    } while (pbVar10 < pbVar13);
  }
  iVar5 = (int)lVar12;
  if (iVar5 != iVar7) {
    __assert_fail("i == nVarsF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x6ae,
                  "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                 );
  }
  if (pbVar10 != pbVar13) {
    __assert_fail("*p == q",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x6af,
                  "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                 );
  }
  pLits_00 = local_268;
  pTruth = local_238;
  iVar7 = 6;
LAB_00424b43:
  uVar6 = If_DsdManOperation(pMan,iVar7,(int *)pLits_00,iVar5,pPerm + iVar3,pTruth);
  return cVar1 == '!' ^ uVar6;
}

Assistant:

int If_DsdManAddDsd_rec( char * pStr, char ** p, int * pMatches, If_DsdMan_t * pMan, word * pTruth, unsigned char * pPerm, int * pnSupp )
{
    unsigned char * pPermStart = pPerm + *pnSupp;
    int iRes = -1, fCompl = 0;
    if ( **p == '!' )
    {
        fCompl = 1;
        (*p)++;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        pPerm[(*pnSupp)++] = Abc_Var2Lit( **p - 'a', fCompl );
        return 2;
    }
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int Type = 0, nLits = 0, pLits[DAU_MAX_VAR];
        char * q = pStr + pMatches[ *p - pStr ];
        if ( **p == '(' )
            Type = DAU_DSD_AND;
        else if ( **p == '[' )
            Type = DAU_DSD_XOR;
        else if ( **p == '<' )
            Type = DAU_DSD_MUX;
        else if ( **p == '{' )
            Type = DAU_DSD_PRIME;
        else assert( 0 );
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            pLits[nLits++] = If_DsdManAddDsd_rec( pStr, p, pMatches, pMan, pTruth, pPerm, pnSupp );
        assert( *p == q );
        iRes = If_DsdManOperation( pMan, Type, pLits, nLits, pPermStart, pTruth );
        return Abc_LitNotCond( iRes, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word pFunc[DAU_MAX_WORD];
        int nLits = 0, pLits[DAU_MAX_VAR];
        char * q;
        int i, nVarsF = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVarsF );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            pLits[nLits++] = If_DsdManAddDsd_rec( pStr, p, pMatches, pMan, pTruth, pPerm, pnSupp );
        assert( i == nVarsF );
        assert( *p == q );
        iRes = If_DsdManOperation( pMan, DAU_DSD_PRIME, pLits, nLits, pPermStart, pFunc );
        return Abc_LitNotCond( iRes, fCompl );
    }
    assert( 0 );
    return -1;
}